

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O2

void __thiscall amrex::Amr::writePlotFileDoit(Amr *this,string *pltfile,bool regular)

{
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  int i;
  long lVar5;
  ostringstream *poVar6;
  int k;
  allocator local_49d;
  int local_49c;
  double local_498;
  string *local_490;
  undefined4 local_484;
  double local_480;
  IO_Buffer io_buffer;
  string HeaderFileName;
  string pltfileTemp;
  StreamRetry sretry;
  Print local_3b8;
  ofstream HeaderFile;
  double local_228 [3];
  int aiStack_210 [120];
  
  local_480 = second();
  VisMF::SetNOutFiles((anonymous_namespace)::plot_nfiles,ParallelDescriptor::m_comm);
  local_484 = VisMF::currentVersion;
  VisMF::currentVersion = (anonymous_namespace)::plot_headerversion;
  local_490 = pltfile;
  StreamRetry::StreamRetry
            (&sretry,pltfile,this->abort_on_stream_retry_failure,this->stream_max_tries);
  bVar2 = AsyncOut::UseAsyncOut();
  if (bVar2) {
    std::__cxx11::string::string((string *)&pltfileTemp,(string *)local_490);
  }
  else {
    std::operator+(&pltfileTemp,local_490,".temp");
  }
  local_49c = 0;
  do {
    bVar2 = StreamRetry::TryFileOutput(&sretry);
    if (!bVar2) {
LAB_00568294:
      VisMF::currentVersion = local_484;
      std::__cxx11::string::~string((string *)&pltfileTemp);
      StreamRetry::~StreamRetry(&sretry);
      return;
    }
    if ((anonymous_namespace)::precreateDirectories == '\x01') {
      UtilRenameDirectoryToOld(local_490,false);
      UtilCreateCleanDirectory(&pltfileTemp,false);
      for (lVar5 = 0; lVar5 <= *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c
          ; lVar5 = lVar5 + 1) {
        _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        (**(code **)(*(long *)_Var1.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x10))
                  (_Var1.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&pltfileTemp);
      }
      std::__cxx11::string::string
                ((string *)&HeaderFile,"Amr::writePlotFile:PCD",(allocator *)&local_3b8);
      ParallelDescriptor::Barrier((string *)&HeaderFile);
      std::__cxx11::string::~string((string *)&HeaderFile);
    }
    else {
      UtilRenameDirectoryToOld(local_490,false);
      UtilCreateCleanDirectory(&pltfileTemp,true);
    }
    std::operator+(&HeaderFileName,&pltfileTemp,"/Header");
    std::vector<char,_std::allocator<char>_>::vector
              (&io_buffer.super_vector<char,_std::allocator<char>_>,VisMFBuffer::ioBufferSize,
               (allocator_type *)&HeaderFile);
    std::ofstream::ofstream((string *)&HeaderFile);
    (**(code **)((long)local_228[0] + 0x18))
              (local_228,
               io_buffer.super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start,(long)io_buffer.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)io_buffer.super_vector<char,_std::allocator<char>_>.
                              super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start);
    if (*(int *)(ParallelContext::frames + 0xc) == local_49c) {
      std::ofstream::open((char *)&HeaderFile,(_Ios_Openmode)HeaderFileName._M_dataplus._M_p);
      lVar5 = *(long *)(_HeaderFile + -0x18);
      if (*(int *)((long)aiStack_210 + lVar5) != 0) {
        FileOpenFailed(&HeaderFileName);
        lVar5 = *(long *)(_HeaderFile + -0x18);
      }
      local_498 = (double)(long)*(int *)((long)local_228 + lVar5);
      *(undefined8 *)((long)local_228 + lVar5) = 0xf;
    }
    else {
      local_498 = 0.0;
    }
    if (regular) {
      for (lVar5 = 0;
          uVar3 = (ulong)*(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
          lVar5 <= (long)uVar3; lVar5 = lVar5 + 1) {
        _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        (**(code **)(*(long *)_Var1.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x28))
                  (_Var1.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&pltfileTemp,
                   (string *)&HeaderFile);
      }
      for (lVar5 = 0; lVar5 <= (int)uVar3; lVar5 = lVar5 + 1) {
        _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        (**(code **)(*(long *)_Var1.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x20))
                  (_Var1.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&pltfileTemp,
                   (string *)&HeaderFile,1);
        uVar3 = (ulong)*(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
      }
      for (lVar5 = 0; lVar5 <= (int)uVar3; lVar5 = lVar5 + 1) {
        _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        (**(code **)(*(long *)_Var1.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x30))
                  (_Var1.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&pltfileTemp,
                   (string *)&HeaderFile);
        uVar3 = (ulong)*(uint *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
      }
    }
    else {
      for (lVar5 = 0; lVar5 <= *(int *)&(this->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c
          ; lVar5 = lVar5 + 1) {
        _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (this->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        (**(code **)(*(long *)_Var1.
                              super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                              .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 0x38))
                  (_Var1.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,&pltfileTemp,
                   (string *)&HeaderFile,1);
      }
    }
    if ((*(int *)(ParallelContext::frames + 0xc) == local_49c) &&
       (*(double *)((long)local_228 + *(long *)(_HeaderFile + -0x18)) = local_498,
       *(int *)((long)aiStack_210 + *(long *)(_HeaderFile + -0x18)) != 0)) {
      if (regular) {
        Error_host("Amr::writePlotFile() failed");
        goto LAB_005680b2;
      }
      Error_host("Amr::writeSmallPlotFile() failed");
LAB_005680d8:
      this->last_smallplotfile =
           *(this->level_steps).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    }
    else {
      if (!regular) goto LAB_005680d8;
LAB_005680b2:
      this->last_plotfile =
           *(this->level_steps).super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    }
    poVar6 = &local_3b8.ss;
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      local_498 = second();
      local_498 = local_498 - local_480;
      if (regular) {
        poVar4 = OutStream();
        Print::Print(&local_3b8,poVar4);
        poVar6 = &local_3b8.ss;
        std::operator<<((ostream *)poVar6,"Write plotfile time = ");
        std::ostream::_M_insert<double>(local_498);
        std::operator<<((ostream *)poVar6,"  seconds");
        std::operator<<((ostream *)poVar6,"\n\n");
      }
      else {
        poVar4 = OutStream();
        Print::Print(&local_3b8,poVar4);
        std::operator<<((ostream *)poVar6,"Write small plotfile time = ");
        std::ostream::_M_insert<double>(local_498);
        std::operator<<((ostream *)poVar6,"  seconds");
        std::operator<<((ostream *)poVar6,"\n\n");
      }
      Print::~Print(&local_3b8);
    }
    bVar2 = AsyncOut::UseAsyncOut();
    if (bVar2) {
      std::ofstream::~ofstream(&HeaderFile);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                ((_Vector_base<char,_std::allocator<char>_> *)&io_buffer);
      std::__cxx11::string::~string((string *)&HeaderFileName);
      goto LAB_00568294;
    }
    std::__cxx11::string::string((string *)&local_3b8,"Amr::writePlotFile::end",&local_49d);
    ParallelDescriptor::Barrier((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    if (*(int *)(ParallelContext::frames + 0xc) == local_49c) {
      std::ofstream::close();
      rename(pltfileTemp._M_dataplus._M_p,(local_490->_M_dataplus)._M_p);
    }
    std::__cxx11::string::string((string *)&local_3b8,"Renaming temporary plotfile.",&local_49d);
    ParallelDescriptor::Barrier((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::ofstream::~ofstream((string *)&HeaderFile);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&io_buffer);
    std::__cxx11::string::~string((string *)&HeaderFileName);
  } while( true );
}

Assistant:

void
Amr::writePlotFileDoit (std::string const& pltfile, bool regular)
{
    auto dPlotFileTime0 = amrex::second();

    VisMF::SetNOutFiles(plot_nfiles);
    VisMF::Header::Version currentVersion(VisMF::GetHeaderVersion());
    VisMF::SetHeaderVersion(plot_headerversion);

    amrex::StreamRetry sretry(pltfile, abort_on_stream_retry_failure,
                              stream_max_tries);

    const std::string pltfileTemp = (AsyncOut::UseAsyncOut()) ? pltfile : (pltfile + ".temp");

    while(sretry.TryFileOutput()) {
        //
        //  if either the pltfile or pltfileTemp exists, rename them
        //  to move them out of the way.  then create pltfile
        //  with the temporary name, then rename it back when
        //  it is finished writing.  then stream retry can rename
        //  it to a bad suffix if there were stream errors.
        //

        if (precreateDirectories) {    // ---- make all directories at once
            amrex::UtilRenameDirectoryToOld(pltfile, false);      // dont call barrier
            amrex::UtilCreateCleanDirectory(pltfileTemp, false);  // dont call barrier
            for(int i(0); i <= finest_level; ++i) {
                amr_level[i]->CreateLevelDirectory(pltfileTemp);
            }
            ParallelDescriptor::Barrier("Amr::writePlotFile:PCD");
        } else {
            amrex::UtilRenameDirectoryToOld(pltfile, false);     // dont call barrier
            amrex::UtilCreateCleanDirectory(pltfileTemp, true);  // call barrier
        }

        std::string HeaderFileName(pltfileTemp + "/Header");

        VisMF::IO_Buffer io_buffer(VisMF::GetIOBufferSize());

        std::ofstream HeaderFile;

        HeaderFile.rdbuf()->pubsetbuf(io_buffer.dataPtr(), io_buffer.size());

        int old_prec(0);

        if (ParallelDescriptor::IOProcessor()) {
            //
            // Only the IOProcessor() writes to the header file.
            //
            HeaderFile.open(HeaderFileName.c_str(), std::ios::out | std::ios::trunc |
                            std::ios::binary);
            if ( ! HeaderFile.good()) {
                amrex::FileOpenFailed(HeaderFileName);
            }
            old_prec = HeaderFile.precision(15);
        }

        if (regular) {
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFilePre(pltfileTemp, HeaderFile);
            }
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFile(pltfileTemp, HeaderFile);
            }
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writePlotFilePost(pltfileTemp, HeaderFile);
            }
        } else {
            for (int k(0); k <= finest_level; ++k) {
                amr_level[k]->writeSmallPlotFile(pltfileTemp, HeaderFile);
            }
        }

        if (ParallelDescriptor::IOProcessor()) {
            HeaderFile.precision(old_prec);
            if ( ! HeaderFile.good()) {
                if (regular) {
                    amrex::Error("Amr::writePlotFile() failed");
                } else {
                    amrex::Error("Amr::writeSmallPlotFile() failed");
                }
            }
        }

        if (regular) {
            last_plotfile = level_steps[0];
        } else {
            last_smallplotfile = level_steps[0];
        }

        if (verbose > 0) {
            const int IOProc        = ParallelDescriptor::IOProcessorNumber();
            auto      dPlotFileTime = amrex::second() - dPlotFileTime0;
            ParallelDescriptor::ReduceRealMax(dPlotFileTime,IOProc);
            if (regular) {
                amrex::Print() << "Write plotfile time = " << dPlotFileTime << "  seconds" << "\n\n";
            } else {
                amrex::Print() << "Write small plotfile time = " << dPlotFileTime << "  seconds" << "\n\n";
            }
        }

        if (AsyncOut::UseAsyncOut()) {
            break;
        } else {
            ParallelDescriptor::Barrier("Amr::writePlotFile::end");
            if(ParallelDescriptor::IOProcessor()) {
                HeaderFile.close();
                std::rename(pltfileTemp.c_str(), pltfile.c_str());
            }
            ParallelDescriptor::Barrier("Renaming temporary plotfile.");
            //
            // the plotfile file now has the regular name
            //
        }
    }  // end while

    VisMF::SetHeaderVersion(currentVersion);
}